

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall duckdb::DatabaseInstance::DatabaseInstance(DatabaseInstance *this)

{
  long in_RDI;
  ValidChecker *this_00;
  DBConfig *in_stack_000000f0;
  
  enable_shared_from_this<duckdb::DatabaseInstance>::enable_shared_from_this
            ((enable_shared_from_this<duckdb::DatabaseInstance> *)0x882968);
  DBConfig::DBConfig(in_stack_000000f0);
  shared_ptr<duckdb::BufferManager,_true>::shared_ptr
            ((shared_ptr<duckdb::BufferManager,_true> *)0x882993);
  this_00 = (ValidChecker *)(in_RDI + 0x6c0);
  unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true>::
  unique_ptr((unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true>
              *)0x8829ab);
  unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true>::unique_ptr
            ((unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true> *)
             0x8829c1);
  unique_ptr<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>,_true>::unique_ptr
            ((unique_ptr<duckdb::ObjectCache,_std::default_delete<duckdb::ObjectCache>,_true> *)
             0x8829d7);
  unique_ptr<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>,_true>::
  unique_ptr((unique_ptr<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>,_true>
              *)0x8829ed);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>_>
                   *)0x882a03);
  ValidChecker::ValidChecker(this_00);
  unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>,_true>::
  unique_ptr((unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>,_true>
              *)0x882a30);
  shared_ptr<duckdb::LogManager,_true>::shared_ptr((shared_ptr<duckdb::LogManager,_true> *)0x882a41)
  ;
  unique_ptr<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>,_true>::
  unique_ptr((unique_ptr<duckdb::ExternalFileCache,_std::default_delete<duckdb::ExternalFileCache>,_true>
              *)0x882a54);
  *(undefined1 *)(in_RDI + 0x6a8) = 0;
  *(undefined8 *)(in_RDI + 0x788) = 0;
  return;
}

Assistant:

DatabaseInstance::DatabaseInstance() {
	config.is_user_config = false;
	create_api_v1 = nullptr;
}